

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O1

int tinsert(lua_State *L)

{
  bool bVar1;
  int iVar2;
  lua_Integer n;
  long n_00;
  
  checktab(L,1,7);
  n = luaL_len(L,1);
  iVar2 = lua_gettop(L);
  n_00 = n + 1;
  if (iVar2 != 2) {
    if (iVar2 != 3) {
      iVar2 = luaL_error(L,"wrong number of arguments to \'insert\'");
      return iVar2;
    }
    n_00 = luaL_checkinteger(L,2);
    if (n + 1 < n_00 || n_00 < 1) {
      luaL_argerror(L,2,"position out of bounds");
    }
    if (n_00 <= n) {
      do {
        lua_geti(L,1,n);
        lua_seti(L,1,n + 1);
        bVar1 = n_00 < n;
        n = n + -1;
      } while (bVar1);
    }
  }
  lua_seti(L,1,n_00);
  return 0;
}

Assistant:

static int tinsert(lua_State *L) {
    lua_Integer e = aux_getn(L, 1, TAB_RW) + 1;  /* first empty element */
    lua_Integer pos;  /* where to insert new element */
    switch (lua_gettop(L)) {
        case 2: {  /* called with only 2 arguments */
            pos = e;  /* insert new element at the end */
            break;
        }
        case 3: {
            lua_Integer i;
            pos = luaL_checkinteger(L, 2);  /* 2nd argument is the position */
            luaL_argcheck(L, 1 <= pos && pos <= e, 2, "position out of bounds");
            for (i = e; i > pos; i--) {  /* move up elements */
                lua_geti(L, 1, i - 1);
                lua_seti(L, 1, i);  /* t[i] = t[i - 1] */
            }
            break;
        }
        default: {
            return luaL_error(L, "wrong number of arguments to 'insert'");
        }
    }
    lua_seti(L, 1, pos);  /* t[pos] = v */
    return 0;
}